

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out.c
# Opt level: O3

LY_ERR ly_write_skip(ly_out *out,size_t count,size_t *position)

{
  char *pcVar1;
  size_t sVar2;
  char **ppcVar3;
  undefined1 auVar4 [16];
  
  switch(out->type) {
  case LY_OUT_FD:
  case LY_OUT_FDSTREAM:
  case LY_OUT_FILE:
  case LY_OUT_FILEPATH:
  case LY_OUT_CALLBACK:
    sVar2 = out->buf_len;
    if (out->buf_size < sVar2 + count) {
      pcVar1 = (char *)ly_realloc(out->buffered,sVar2 + count);
      out->buffered = pcVar1;
      if (pcVar1 == (char *)0x0) {
        out->buf_len = 0;
        out->buf_size = 0;
LAB_0013b710:
        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_write_skip");
        return LY_EMEM;
      }
      sVar2 = out->buf_len;
      out->buf_size = sVar2 + count;
    }
    *position = sVar2;
    out->buf_len = out->buf_len + count;
    ppcVar3 = (char **)&out->hole_count;
    sVar2 = 1;
    break;
  case LY_OUT_MEMORY:
    ppcVar3 = &(out->method).fpath.filepath;
    pcVar1 = (out->method).fpath.filepath;
    if ((char *)(out->method).mem.size < pcVar1 + count) {
      pcVar1 = (char *)ly_realloc(*(out->method).mem.buf,(size_t)(pcVar1 + count));
      *(out->method).mem.buf = pcVar1;
      if (*(out->method).mem.buf == (char *)0x0) {
        *(undefined1 (*) [16])ppcVar3 = (undefined1  [16])0x0;
        goto LAB_0013b710;
      }
      pcVar1 = (out->method).fpath.filepath;
      (out->method).mem.size = (size_t)(pcVar1 + count);
    }
    *position = (size_t)pcVar1;
    sVar2 = count;
    break;
  case LY_OUT_ERROR:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/out.c",0x2dd);
    return LY_EINT;
  default:
    goto switchD_0013b625_default;
  }
  *ppcVar3 = *ppcVar3 + sVar2;
switchD_0013b625_default:
  auVar4._8_4_ = (int)count;
  auVar4._0_8_ = count;
  auVar4._12_4_ = (int)(count >> 0x20);
  out->printed = count + out->printed;
  out->func_printed = auVar4._8_8_ + out->func_printed;
  return LY_SUCCESS;
}

Assistant:

LY_ERR
ly_write_skip(struct ly_out *out, size_t count, size_t *position)
{
    switch (out->type) {
    case LY_OUT_MEMORY:
        if (out->method.mem.len + count > out->method.mem.size) {
            *out->method.mem.buf = ly_realloc(*out->method.mem.buf, out->method.mem.len + count);
            if (!(*out->method.mem.buf)) {
                out->method.mem.len = 0;
                out->method.mem.size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->method.mem.size = out->method.mem.len + count;
        }

        /* save the current position */
        *position = out->method.mem.len;

        /* skip the memory */
        out->method.mem.len += count;
        break;
    case LY_OUT_FD:
    case LY_OUT_FDSTREAM:
    case LY_OUT_FILEPATH:
    case LY_OUT_FILE:
    case LY_OUT_CALLBACK:
        /* buffer the hole */
        if (out->buf_len + count > out->buf_size) {
            out->buffered = ly_realloc(out->buffered, out->buf_len + count);
            if (!out->buffered) {
                out->buf_len = 0;
                out->buf_size = 0;
                LOGMEM(NULL);
                return LY_EMEM;
            }
            out->buf_size = out->buf_len + count;
        }

        /* save the current position */
        *position = out->buf_len;

        /* skip the memory */
        out->buf_len += count;

        /* increase hole counter */
        ++out->hole_count;
        break;
    case LY_OUT_ERROR:
        LOGINT(NULL);
        return LY_EINT;
    }

    /* update printed bytes counter despite we actually printed just a hole */
    out->printed += count;
    out->func_printed += count;
    return LY_SUCCESS;
}